

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<const_kj::FsNode> __thiscall
kj::anon_unknown_8::DiskReadableFile::cloneFsNode(DiskReadableFile *this)

{
  AutoCloseFd in_RAX;
  AutoCloseFd AVar1;
  int in_ECX;
  void *in_RDX;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode> OVar2;
  AutoCloseFd local_18;
  
  local_18 = in_RAX;
  DiskHandle::clone((DiskHandle *)&local_18,(__fn *)(in_RSI + 8),in_RDX,in_ECX,in_R8);
  AVar1 = (AutoCloseFd)operator_new(0x10);
  *(undefined ***)AVar1 = &PTR_getFd_0046cc90;
  *(int *)((long)AVar1 + 8) = local_18.fd;
  UnwindDetector::UnwindDetector((UnwindDetector *)((long)AVar1 + 0xc));
  local_18.fd = -1;
  *(undefined ***)AVar1 = &PTR_getFd_0046c1e0;
  (this->super_ReadableFile).super_FsNode._vptr_FsNode =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DiskReadableFile>::instance;
  (this->super_DiskHandle).fd = AVar1;
  AutoCloseFd::~AutoCloseFd(&local_18);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const override {
    return DiskHandle::read(offset, buffer);
  }